

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute_struct *
pugi::impl::anon_unknown_0::append_new_attribute(xml_node_struct *node,xml_allocator *alloc)

{
  bool bVar1;
  xml_attribute_struct *attr;
  xml_allocator *alloc_local;
  xml_node_struct *node_local;
  
  bVar1 = xml_allocator::reserve(alloc);
  if (bVar1) {
    node_local = (xml_node_struct *)allocate_attribute(alloc);
    if (node_local == (xml_node_struct *)0x0) {
      node_local = (xml_node_struct *)0x0;
    }
    else {
      append_attribute((xml_attribute_struct *)node_local,node);
    }
  }
  else {
    node_local = (xml_node_struct *)0x0;
  }
  return (xml_attribute_struct *)node_local;
}

Assistant:

PUGI__FN_NO_INLINE xml_attribute_struct* append_new_attribute(xml_node_struct* node, xml_allocator& alloc)
	{
		if (!alloc.reserve()) return 0;

		xml_attribute_struct* attr = allocate_attribute(alloc);
		if (!attr) return 0;

		append_attribute(attr, node);

		return attr;
	}